

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O0

void __thiscall
gss::innards::Proof::incompatible_by_nds
          (Proof *this,int g,NamedVertex *p,NamedVertex *t,
          vector<int,_std::allocator<int>_> *p_subsequence,
          vector<int,_std::allocator<int>_> *t_subsequence,
          vector<int,_std::allocator<int>_> *t_remaining)

{
  reference __a;
  bool bVar1;
  type pbVar2;
  ostream *poVar3;
  pointer pIVar4;
  size_type sVar5;
  __tuple_element_t<1UL,_tuple<long,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>_>_>
  *p_Var6;
  const_reference pvVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  int *in_RCX;
  int *in_RDX;
  int in_ESI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  int *n_5;
  const_iterator __end1_5;
  const_iterator __begin1_5;
  vector<int,_std::allocator<int>_> *__range1_5;
  int *u_1;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<int,_std::allocator<int>_> *__range2_3;
  int *n_4;
  const_iterator __end1_4;
  const_iterator __begin1_4;
  vector<int,_std::allocator<int>_> *__range1_4;
  int *t_2;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  vector<int,_std::allocator<int>_> *__range1_3;
  int *n_3;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<int,_std::allocator<int>_> *__range1_2;
  bool first;
  int *n_2;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  int *u;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<int,_std::allocator<int>_> *__range2_2;
  int *n_1;
  const_iterator __end1;
  const_iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  int *t_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<int,_std::allocator<int>_> *__range2_1;
  int *n;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  map<long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffd08;
  tuple<long,_long,_long,_long> *in_stack_fffffffffffffd10;
  map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  key_type *in_stack_fffffffffffffd18;
  map<std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffd20;
  key_type *in_stack_fffffffffffffd48;
  ostream *in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd70;
  undefined8 in_stack_fffffffffffffd78;
  Proof *in_stack_fffffffffffffd80;
  undefined8 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  int iVar10;
  int in_stack_fffffffffffffd94;
  pair<int,_int> local_260;
  pair<long,_long> local_258;
  pair<int,_int> local_248;
  pair<long,_long> local_240;
  reference local_230;
  int *local_228;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_220;
  undefined8 local_218;
  pair<int,_int> local_210;
  pair<long,_long> local_208;
  reference local_1f8;
  int *local_1f0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1e8;
  undefined8 local_1e0;
  reference local_1d8;
  int *local_1d0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1c8;
  undefined8 local_1c0;
  long local_1b8;
  _Base_ptr local_1b0;
  int *local_1a8;
  int *local_1a0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_198;
  undefined8 local_190;
  reference local_f8;
  int *local_f0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_e8;
  undefined8 local_e0;
  byte local_d1;
  reference local_d0;
  int *local_c8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_c0;
  undefined8 local_b8;
  reference local_b0;
  int *local_a8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_a0;
  undefined8 local_98;
  reference local_90;
  int *local_88;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  undefined8 local_78;
  reference local_70;
  int *local_68;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  undefined8 local_58;
  reference local_50;
  int *local_48;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  int *local_20;
  int *local_18;
  int local_c;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x13e6a3);
  pbVar2 = std::
           unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
           ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        *)in_stack_fffffffffffffd10);
  poVar3 = std::operator<<(pbVar2,"* cannot map ");
  poVar3 = std::operator<<(poVar3,(string *)(local_18 + 2));
  poVar3 = std::operator<<(poVar3," to ");
  poVar3 = std::operator<<(poVar3,(string *)(local_20 + 2));
  poVar3 = std::operator<<(poVar3," due to nds in graph pairs ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c);
  std::operator<<(poVar3,'\n');
  pIVar4 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x13e730);
  if ((pIVar4->recover_encoding & 1U) != 0) {
    local_38 = local_28;
    local_40._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd08);
    local_48 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd08);
    while (bVar1 = __gnu_cxx::operator==<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_fffffffffffffd10,
                              (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_fffffffffffffd08), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_50 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&local_40);
      recover_adjacency_lines
                (in_stack_fffffffffffffd80,(int)((ulong)in_stack_fffffffffffffd78 >> 0x20),
                 (int)in_stack_fffffffffffffd78,(int)((ulong)in_stack_fffffffffffffd70 >> 0x20),
                 (int)in_stack_fffffffffffffd70);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_40);
    }
    local_58 = local_30;
    local_60._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd08);
    local_68 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd08);
    while (bVar1 = __gnu_cxx::operator==<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_fffffffffffffd10,
                              (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_fffffffffffffd08), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_70 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&local_60);
      in_stack_fffffffffffffd94 = *local_70;
      pvVar7 = std::vector<int,_std::allocator<int>_>::back
                         ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd10);
      if (in_stack_fffffffffffffd94 != *pvVar7) {
        recover_injectivity_constraint
                  ((Proof *)in_stack_fffffffffffffd50,
                   (int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_60);
    }
  }
  local_78 = local_28;
  local_80._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd08);
  local_88 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd08);
  while (bVar1 = __gnu_cxx::operator==<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                           ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_fffffffffffffd10,
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_fffffffffffffd08), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_90 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_80);
    local_98 = in_stack_00000008;
    local_a0._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd08);
    local_a8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd08);
    while (bVar1 = __gnu_cxx::operator==<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_fffffffffffffd10,
                              (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_fffffffffffffd08), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_b0 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&local_a0);
      need_elimination((Proof *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                       (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                       (int)in_stack_fffffffffffffd88);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_a0);
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_80);
  }
  local_b8 = local_28;
  local_c0._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd08);
  local_c8 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd08);
  while (bVar1 = __gnu_cxx::operator==<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                           ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_fffffffffffffd10,
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_fffffffffffffd08), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_d0 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_c0);
    iVar10 = *local_d0;
    std::vector<int,_std::allocator<int>_>::back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd10);
    need_elimination((Proof *)CONCAT44(in_stack_fffffffffffffd94,iVar10),
                     (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),(int)in_stack_fffffffffffffd88)
    ;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_c0);
  }
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x13ea8b);
  pbVar2 = std::
           unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
           ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        *)in_stack_fffffffffffffd10);
  std::operator<<(pbVar2,"p");
  local_d1 = 1;
  local_e0 = local_28;
  local_e8._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd08);
  local_f0 = (int *)std::vector<int,_std::allocator<int>_>::end
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd08);
  while (bVar1 = __gnu_cxx::operator==<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                           ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_fffffffffffffd10,
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_fffffffffffffd08), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_f8 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_e8);
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x13eb2d);
    std::tuple<int,_int,_int,_int>::tuple<int_&,_const_int_&,_const_int_&,_const_int_&,_true,_true>
              ((tuple<int,_int,_int,_int> *)in_stack_fffffffffffffd20,
               (int *)in_stack_fffffffffffffd18,(int *)in_stack_fffffffffffffd10,
               (int *)in_stack_fffffffffffffd08,(int *)0x13eb68);
    std::tuple<long,_long,_long,_long>::tuple<int,_int,_int,_int,_true,_true>
              (in_stack_fffffffffffffd10,(tuple<int,_int,_int,_int> *)in_stack_fffffffffffffd08);
    sVar5 = std::
            map<std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::count(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    if (sVar5 != 0) {
      if ((local_d1 & 1) == 0) {
        std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
        operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    *)0x13ec75);
        pbVar2 = std::
                 unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                              *)in_stack_fffffffffffffd10);
        poVar3 = std::operator<<(pbVar2," ");
        std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
        operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    *)0x13eca5);
        std::tuple<int,_int,_int,_int>::
        tuple<int_&,_const_int_&,_const_int_&,_const_int_&,_true,_true>
                  ((tuple<int,_int,_int,_int> *)in_stack_fffffffffffffd20,
                   (int *)in_stack_fffffffffffffd18,(int *)in_stack_fffffffffffffd10,
                   (int *)in_stack_fffffffffffffd08,(int *)0x13ecdd);
        std::tuple<long,_long,_long,_long>::tuple<int,_int,_int,_int,_true,_true>
                  (in_stack_fffffffffffffd10,(tuple<int,_int,_int,_int> *)in_stack_fffffffffffffd08)
        ;
        std::
        map<std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator[]((map<std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)in_stack_fffffffffffffd50,(key_type *)in_stack_fffffffffffffd48);
        p_Var6 = std::get<1ul,long,long,std::__cxx11::string>
                           ((tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)0x13ed0c);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*p_Var6);
        std::operator<<(poVar3," +");
      }
      else {
        local_d1 = 0;
        std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
        operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    *)0x13ebbf);
        pbVar2 = std::
                 unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                 ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                              *)in_stack_fffffffffffffd10);
        poVar3 = std::operator<<(pbVar2," ");
        std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
        operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    *)0x13ebef);
        std::tuple<int,_int,_int,_int>::
        tuple<int_&,_const_int_&,_const_int_&,_const_int_&,_true,_true>
                  ((tuple<int,_int,_int,_int> *)in_stack_fffffffffffffd20,
                   (int *)in_stack_fffffffffffffd18,(int *)in_stack_fffffffffffffd10,
                   (int *)in_stack_fffffffffffffd08,(int *)0x13ec27);
        std::tuple<long,_long,_long,_long>::tuple<int,_int,_int,_int,_true,_true>
                  (in_stack_fffffffffffffd10,(tuple<int,_int,_int,_int> *)in_stack_fffffffffffffd08)
        ;
        std::
        map<std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::operator[]((map<std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)in_stack_fffffffffffffd50,(key_type *)in_stack_fffffffffffffd48);
        p_Var6 = std::get<1ul,long,long,std::__cxx11::string>
                           ((tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)0x13ec56);
        std::ostream::operator<<(poVar3,*p_Var6);
      }
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_e8);
  }
  local_190 = local_30;
  local_198._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd08);
  local_1a0 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd08);
  while (bVar1 = __gnu_cxx::operator==<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                           ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_fffffffffffffd10,
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_fffffffffffffd08), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_1a8 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_198);
    iVar10 = *local_1a8;
    pvVar7 = std::vector<int,_std::allocator<int>_>::back
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd10);
    if (iVar10 != *pvVar7) {
      std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
      operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                  *)0x13ede4);
      pbVar2 = std::
               unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                            *)in_stack_fffffffffffffd10);
      poVar3 = std::operator<<(pbVar2," ");
      std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
      operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                  *)0x13ee14);
      local_1b8 = (long)*local_1a8;
      local_1b0 = (_Base_ptr)
                  std::
                  map<long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::find(in_stack_fffffffffffffd08,(key_type_conflict *)0x13ee3e);
      std::
      _Rb_tree_iterator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)0x13ee53);
      p_Var6 = std::get<1ul,long,long,std::__cxx11::string>
                         ((tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0x13ee5f);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*p_Var6);
      std::operator<<(poVar3," +");
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_198);
  }
  local_1c0 = local_28;
  local_1c8._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd08);
  local_1d0 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd08);
  while (bVar1 = __gnu_cxx::operator==<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                           ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_fffffffffffffd10,
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_fffffffffffffd08), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_1d8 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_1c8);
    local_1e0 = in_stack_00000008;
    local_1e8._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd08);
    local_1f0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd08);
    while (bVar1 = __gnu_cxx::operator==<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_fffffffffffffd10,
                              (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_fffffffffffffd08), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_1f8 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                  ::operator*(&local_1e8);
      std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
      operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                  *)0x13ef7a);
      pbVar2 = std::
               unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                            *)in_stack_fffffffffffffd10);
      in_stack_fffffffffffffd50 = std::operator<<(pbVar2," ");
      pIVar4 = std::
               unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
               ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             *)0x13efaa);
      in_stack_fffffffffffffd48 = (key_type *)&pIVar4->eliminations;
      std::pair<int,_int>::pair<int,_int,_true>(&local_210,local_1d8,local_1f8);
      std::pair<long,_long>::pair<int,_int,_true>(&local_208,&local_210);
      pmVar8 = std::
               map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
               ::operator[]((map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                             *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      poVar3 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffd50,*pmVar8);
      std::operator<<(poVar3," +");
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_1e8);
    }
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_1c8);
  }
  local_218 = local_28;
  local_220._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd08);
  local_228 = (int *)std::vector<int,_std::allocator<int>_>::end
                               ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd08);
  while (bVar1 = __gnu_cxx::operator==<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                           ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_fffffffffffffd10,
                            (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                             *)in_stack_fffffffffffffd08), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_230 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_220);
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x13f0b7);
    pbVar2 = std::
             unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                          *)in_stack_fffffffffffffd10);
    poVar3 = std::operator<<(pbVar2," ");
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x13f0e7);
    __a = local_230;
    pvVar7 = std::vector<int,_std::allocator<int>_>::back
                       ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd10);
    std::pair<int,_int>::pair<int,_int,_true>(&local_248,__a,pvVar7);
    std::pair<long,_long>::pair<int,_int,_true>(&local_240,&local_248);
    pmVar8 = std::
             map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
             ::operator[]((map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                           *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pmVar8);
    std::operator<<(poVar3," +");
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_220);
  }
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x13f183);
  pbVar2 = std::
           unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
           ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        *)in_stack_fffffffffffffd10);
  std::operator<<(pbVar2," s 0\n");
  pIVar4 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x13f1ae);
  pIVar4->proof_line = pIVar4->proof_line + 1;
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x13f1cd);
  pbVar2 = std::
           unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
           ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        *)in_stack_fffffffffffffd10);
  poVar3 = std::operator<<(pbVar2,"ia 1 ~x");
  pIVar4 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x13f1fd);
  this_00 = &pIVar4->variable_mappings;
  std::pair<int,_int>::pair<int,_int,_true>(&local_260,local_18,local_20);
  std::pair<long,_long>::pair<int,_int,_true>(&local_258,&local_260);
  pmVar9 = std::
           map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  poVar3 = std::operator<<(poVar3,(string *)pmVar9);
  poVar3 = std::operator<<(poVar3," >= 1 ; ");
  pIVar4 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x13f27a);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pIVar4->proof_line);
  std::operator<<(poVar3,'\n');
  pIVar4 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x13f2a5);
  pIVar4->proof_line = pIVar4->proof_line + 1;
  std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
  operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_> *
             )0x13f2c4);
  pbVar2 = std::
           unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
           ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                        *)this_00);
  poVar3 = std::operator<<(pbVar2,"d ");
  pIVar4 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x13f2f4);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pIVar4->proof_line + -1);
  std::operator<<(poVar3," 0\n");
  return;
}

Assistant:

auto Proof::incompatible_by_nds(
    int g,
    const NamedVertex & p,
    const NamedVertex & t,
    const vector<int> & p_subsequence,
    const vector<int> & t_subsequence,
    const vector<int> & t_remaining) -> void
{
    *_imp->proof_stream << "* cannot map " << p.second << " to " << t.second << " due to nds in graph pairs " << g << '\n';

    if (_imp->recover_encoding) {
        for (auto & n : p_subsequence)
            recover_adjacency_lines(g, p.first, n, t.first);
        for (auto & t : t_subsequence)
            if (t != t_subsequence.back())
                recover_injectivity_constraint(t);
    }

    for (auto & n : p_subsequence)
        for (auto & u : t_remaining)
            need_elimination(n, u);
    for (auto & n : p_subsequence)
        need_elimination(n, t_subsequence.back());

    // summing up horizontally
    *_imp->proof_stream << "p";
    bool first = true;
    for (auto & n : p_subsequence) {
        // due to loops or labels, it might not be possible to map n to t.first
        if (_imp->adjacency_lines.count(tuple{g, p.first, n, t.first})) {
            if (first) {
                first = false;
                *_imp->proof_stream << " " << get<1>(_imp->adjacency_lines[tuple{g, p.first, n, t.first}]);
            }
            else
                *_imp->proof_stream << " " << get<1>(_imp->adjacency_lines[tuple{g, p.first, n, t.first}]) << " +";
        }
    }

    // injectivity in the square
    for (auto & t : t_subsequence) {
        if (t != t_subsequence.back())
            *_imp->proof_stream << " " << get<1>(_imp->injectivity_constraints.find(t)->second) << " +";
    }

    // block to the right of the failing square
    for (auto & n : p_subsequence) {
        for (auto & u : t_remaining) {
            /* n -> t is already eliminated by degree or loop */
            *_imp->proof_stream << " " << _imp->eliminations[pair{n, u}] << " +";
        }
    }

    // final column
    for (auto & n : p_subsequence) {
        /* n -> t is already eliminated by degree or loop */
        *_imp->proof_stream << " " << _imp->eliminations[pair{n, t_subsequence.back()}] << " +";
    }

    *_imp->proof_stream << " s 0\n";
    ++_imp->proof_line;

    *_imp->proof_stream << "ia 1 ~x" << _imp->variable_mappings[pair{p.first, t.first}] << " >= 1 ; " << _imp->proof_line << '\n';
    ++_imp->proof_line;

    *_imp->proof_stream << "d " << _imp->proof_line - 1 << " 0\n";
}